

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O3

int ARKStepGetNumRhsEvals(void *arkode_mem,long *fe_evals,long *fi_evals)

{
  int iVar1;
  
  iVar1 = ARKodeGetNumRhsEvals(arkode_mem,0,fe_evals);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = ARKodeGetNumRhsEvals(arkode_mem,1,fi_evals);
  return iVar1;
}

Assistant:

int ARKStepGetNumRhsEvals(void* arkode_mem, long int* fe_evals, long int* fi_evals)
{
  int retval = ARK_SUCCESS;

  retval = ARKodeGetNumRhsEvals(arkode_mem, 0, fe_evals);
  if (retval != ARK_SUCCESS) { return retval; }

  retval = ARKodeGetNumRhsEvals(arkode_mem, 1, fi_evals);
  if (retval != ARK_SUCCESS) { return retval; }

  return ARK_SUCCESS;
}